

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O2

void buffer_munmap(uint32_t id)

{
  cpu_mapping *__ptr;
  
  if ((((max_id != 0xffffffff) && (id <= max_id)) &&
      (__ptr = cpu_mappings[id], __ptr != (cpu_mapping *)0x0)) &&
     ((__ptr->object == (gpu_object *)0x0 && (__ptr->next == (cpu_mapping *)0x0)))) {
    free(__ptr->data);
    free(__ptr);
    set_cpu_mapping(id,(cpu_mapping *)0x0);
    return;
  }
  fprintf(_stdout,"ERROR: inconsistent mapping data%s\n","");
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  demmt_abort();
}

Assistant:

void buffer_munmap(uint32_t id)
{
	struct cpu_mapping *mapping = get_cpu_mapping(id);
	if (!mapping || mapping->object || mapping->next)
	{
		mmt_error("inconsistent mapping data%s\n", "");
		demmt_abort();
	}
	free(mapping->data);
	// catch use-after-free bugs ASAP
	memset(mapping, 0xff, sizeof(*mapping));
	free(mapping);
	set_cpu_mapping(id, NULL);
}